

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_channel_converter_get_heap_layout
                    (ma_channel_converter_config *pConfig,
                    ma_channel_converter_heap_layout *pHeapLayout)

{
  uint channels;
  uint channels_00;
  ma_channel *pChannelMap;
  ma_channel *pChannelMap_00;
  ma_bool32 mVar1;
  ma_channel_conversion_path mVar2;
  ma_result mVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  mVar3 = MA_INVALID_ARGS;
  if (pConfig != (ma_channel_converter_config *)0x0) {
    channels = pConfig->channelsIn;
    uVar5 = (ulong)channels;
    if (uVar5 != 0) {
      channels_00 = pConfig->channelsOut;
      uVar6 = (ulong)channels_00;
      if (uVar6 != 0) {
        pChannelMap = pConfig->pChannelMapIn;
        mVar1 = ma_channel_map_is_valid(pChannelMap,channels);
        if (mVar1 != 0) {
          pChannelMap_00 = pConfig->pChannelMapOut;
          mVar1 = ma_channel_map_is_valid(pChannelMap_00,channels_00);
          if (mVar1 != 0) {
            pHeapLayout->sizeInBytes = 0;
            pHeapLayout->channelMapInOffset = 0;
            if (pChannelMap != (ma_channel *)0x0) {
              pHeapLayout->sizeInBytes = uVar5;
            }
            pHeapLayout->channelMapOutOffset = pHeapLayout->sizeInBytes;
            if (pChannelMap_00 != (ma_channel *)0x0) {
              pHeapLayout->sizeInBytes = pHeapLayout->sizeInBytes + uVar6;
            }
            uVar4 = pHeapLayout->sizeInBytes + 7 & 0xfffffffffffffff8;
            pHeapLayout->sizeInBytes = uVar4;
            mVar2 = ma_channel_map_get_conversion_path
                              (pChannelMap,channels,pChannelMap_00,channels_00,pConfig->mixingMode);
            pHeapLayout->shuffleTableOffset = uVar4;
            if (mVar2 == ma_channel_conversion_path_shuffle) {
              pHeapLayout->sizeInBytes = uVar4 + uVar6;
            }
            pHeapLayout->weightsOffset = pHeapLayout->sizeInBytes;
            if (mVar2 == ma_channel_conversion_path_weights) {
              pHeapLayout->sizeInBytes = pHeapLayout->sizeInBytes + (uVar6 * 4 + 8) * uVar5;
            }
            pHeapLayout->sizeInBytes = pHeapLayout->sizeInBytes + 7 & 0xfffffffffffffff8;
            mVar3 = MA_SUCCESS;
          }
        }
      }
    }
  }
  return mVar3;
}

Assistant:

static ma_result ma_channel_converter_get_heap_layout(const ma_channel_converter_config* pConfig, ma_channel_converter_heap_layout* pHeapLayout)
{
    ma_channel_conversion_path conversionPath;

    MA_ASSERT(pHeapLayout != NULL);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->channelsIn == 0 || pConfig->channelsOut == 0) {
        return MA_INVALID_ARGS;
    }

    if (!ma_channel_map_is_valid(pConfig->pChannelMapIn, pConfig->channelsIn)) {
        return MA_INVALID_ARGS;
    }

    if (!ma_channel_map_is_valid(pConfig->pChannelMapOut, pConfig->channelsOut)) {
        return MA_INVALID_ARGS;
    }

    pHeapLayout->sizeInBytes = 0;

    /* Input channel map. Only need to allocate this if we have an input channel map (otherwise default channel map is assumed). */
    pHeapLayout->channelMapInOffset = pHeapLayout->sizeInBytes;
    if (pConfig->pChannelMapIn != NULL) {
        pHeapLayout->sizeInBytes += sizeof(ma_channel) * pConfig->channelsIn;
    }

    /* Output channel map. Only need to allocate this if we have an output channel map (otherwise default channel map is assumed). */
    pHeapLayout->channelMapOutOffset = pHeapLayout->sizeInBytes;
    if (pConfig->pChannelMapOut != NULL) {
        pHeapLayout->sizeInBytes += sizeof(ma_channel) * pConfig->channelsOut;
    }

    /* Alignment for the next section. */
    pHeapLayout->sizeInBytes = ma_align_64(pHeapLayout->sizeInBytes);

    /* Whether or not we use weights of a shuffle table depends on the channel map themselves and the algorithm we've chosen. */
    conversionPath = ma_channel_converter_config_get_conversion_path(pConfig);

    /* Shuffle table */
    pHeapLayout->shuffleTableOffset = pHeapLayout->sizeInBytes;
    if (conversionPath == ma_channel_conversion_path_shuffle) {
        pHeapLayout->sizeInBytes += sizeof(ma_uint8) * pConfig->channelsOut;
    }

    /* Weights */
    pHeapLayout->weightsOffset = pHeapLayout->sizeInBytes;
    if (conversionPath == ma_channel_conversion_path_weights) {
        pHeapLayout->sizeInBytes += sizeof(float*) * pConfig->channelsIn;
        pHeapLayout->sizeInBytes += sizeof(float ) * pConfig->channelsIn * pConfig->channelsOut;
    }

    /* Make sure allocation size is aligned. */
    pHeapLayout->sizeInBytes = ma_align_64(pHeapLayout->sizeInBytes);

    return MA_SUCCESS;
}